

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_morph.cpp
# Opt level: O0

bool __thiscall
ON_Localizer::CreatePlaneLocalizer
          (ON_Localizer *this,ON_3dPoint P,ON_3dVector N,double h0,double h1)

{
  bool bVar1;
  double dVar2;
  double h1_local;
  double h0_local;
  ON_Localizer *this_local;
  
  Destroy(this);
  bVar1 = ON_3dPoint::IsValid(&P);
  if ((((bVar1) && (bVar1 = ON_3dVector::IsValid(&N), bVar1)) &&
      (dVar2 = ON_3dVector::Length(&N), 0.0 < dVar2)) &&
     (((bVar1 = ON_IsValid(h0), bVar1 && (bVar1 = ON_IsValid(h1), bVar1)) &&
      ((h0 != h1 || (NAN(h0) || NAN(h1))))))) {
    (this->m_V).x = N.x;
    (this->m_V).y = N.y;
    (this->m_V).z = N.z;
    ON_3dVector::Unitize(&this->m_V);
    ON_3dPoint::Set(&this->m_P,-((this->m_V).z * P.z + (this->m_V).x * P.x + (this->m_V).y * P.y),
                    0.0,0.0);
    ON_Interval::Set(&this->m_d,h0,h1);
    this->m_type = plane_type;
  }
  return this->m_type == plane_type;
}

Assistant:

bool ON_Localizer::CreatePlaneLocalizer( ON_3dPoint P, ON_3dVector N, double h0, double h1 )
{
  Destroy();
  if ( P.IsValid()
       && N.IsValid()
       && N.Length() > 0.0
       && ON_IsValid(h0)
       && ON_IsValid(h1)
       && h0 != h1 )
  {
    m_V = N;
    m_V.Unitize();
    m_P.Set( -(m_V.x*P.x + m_V.y*P.y + m_V.z*P.z), 0.0, 0.0 );
    m_d.Set(h0,h1);
    m_type = plane_type;
  }
  return (plane_type == m_type);
}